

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Totals * __thiscall
Catch::RunContext::runTest(Totals *__return_storage_ptr__,RunContext *this,TestCase *testCase)

{
  long *plVar1;
  size_type *psVar2;
  size_t *psVar3;
  Counts *pCVar4;
  IStreamingReporter *pIVar5;
  pointer pcVar6;
  int iVar7;
  SectionTracker *pSVar8;
  undefined4 extraout_var;
  mapped_type *pmVar9;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *__x;
  Totals *diff;
  string redirectedCerr;
  string redirectedCout;
  Totals prevTotals;
  string local_248;
  string local_228;
  Totals local_208;
  TestCaseStats local_198;
  
  local_208.error = (this->m_totals).error;
  local_208._4_4_ = *(undefined4 *)&(this->m_totals).field_0x4;
  local_208.skippedTests = (this->m_totals).skippedTests;
  local_208.assertions.passed = (this->m_totals).assertions.passed;
  local_208.assertions.failed = (this->m_totals).assertions.failed;
  local_208.assertions.failedButOk = (this->m_totals).assertions.failedButOk;
  local_208.testCases.passed = (this->m_totals).testCases.passed;
  local_208.testCases.failed = (this->m_totals).testCases.failed;
  local_208.testCases.failedButOk = (this->m_totals).testCases.failedButOk;
  __x = &(this->m_totals).skippedTestReasons;
  clara::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::_Rb_tree(&local_208.skippedTestReasons._M_t,&__x->_M_t);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  local_228._M_string_length = 0;
  local_228.field_2._M_local_buf[0] = '\0';
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  local_248._M_string_length = 0;
  local_248.field_2._M_local_buf[0] = '\0';
  (*(this->super_IResultCapture)._vptr_IResultCapture[9])(this);
  pIVar5 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  (*pIVar5->_vptr_IStreamingReporter[7])(pIVar5,testCase);
  this->m_activeTestCase = testCase;
  pSVar8 = (SectionTracker *)TestCaseTracking::TrackerContext::startRun(&this->m_trackerContext);
  iVar7 = (*(((this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_NonCopyable)._vptr_NonCopyable[0x19])();
  TestCaseTracking::SectionTracker::addInitialFilters
            (pSVar8,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(extraout_var,iVar7));
  psVar2 = &local_198.testInfo.name._M_string_length;
  do {
    (this->m_trackerContext).m_currentTracker =
         (this->m_trackerContext).m_rootTracker.
         super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->m_trackerContext).m_runState = Executing;
    pcVar6 = (testCase->super_TestCaseInfo).name._M_dataplus._M_p;
    local_198._vptr_TestCaseStats = (_func_int **)psVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_198,pcVar6,
               pcVar6 + (testCase->super_TestCaseInfo).name._M_string_length);
    local_198.testInfo.name.field_2._8_8_ = (testCase->super_TestCaseInfo).lineInfo.file;
    local_198.testInfo.className._M_dataplus._M_p =
         (pointer)(testCase->super_TestCaseInfo).lineInfo.line;
    pSVar8 = TestCaseTracking::SectionTracker::acquire
                       (&this->m_trackerContext,(NameAndLocation *)&local_198);
    this->m_testCaseTracker = (ITracker *)pSVar8;
    if (local_198._vptr_TestCaseStats != (_func_int **)psVar2) {
      operator_delete(local_198._vptr_TestCaseStats);
    }
    runCurrentTest(this,&local_228,&local_248);
    iVar7 = (*this->m_testCaseTracker->_vptr_ITracker[3])();
    if ((char)iVar7 != '\0') break;
    uVar12 = (this->m_totals).assertions.failed;
    iVar7 = (*(((this->m_config).
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[9])();
  } while (uVar12 < (ulong)(long)iVar7);
  iVar7 = (*(this->super_IResultCapture)._vptr_IResultCapture[0xb])(this);
  if ((char)iVar7 != '\0') {
    psVar3 = &(this->m_totals).skippedTests;
    *psVar3 = *psVar3 + 1;
    pmVar9 = clara::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::operator[](__x,&this->m_skippedTestReason);
    *pmVar9 = *pmVar9 + 1;
  }
  Totals::operator-(&this->m_totals,&local_208);
  sVar11 = (__return_storage_ptr__->assertions).failed;
  uVar12 = 0x30;
  if (sVar11 == 0) {
    uVar12 = (ulong)((__return_storage_ptr__->assertions).failedButOk != 0) << 4 | 0x28;
  }
  plVar1 = (long *)((long)&__return_storage_ptr__->error + uVar12);
  *plVar1 = *plVar1 + 1;
  sVar10 = (__return_storage_ptr__->testCases).passed;
  if (((byte)(char)(testCase->super_TestCaseInfo).properties >> 2 & sVar10 != 0) == 0) {
    sVar11 = (__return_storage_ptr__->testCases).failed;
  }
  else {
    (__return_storage_ptr__->assertions).failed = sVar11 + 1;
    sVar10 = sVar10 - 1;
    (__return_storage_ptr__->testCases).passed = sVar10;
    sVar11 = (__return_storage_ptr__->testCases).failed + 1;
    (__return_storage_ptr__->testCases).failed = sVar11;
  }
  pCVar4 = &(this->m_totals).testCases;
  pCVar4->passed = pCVar4->passed + sVar10;
  psVar3 = &(this->m_totals).testCases.failed;
  *psVar3 = *psVar3 + sVar11;
  psVar3 = &(this->m_totals).testCases.failedButOk;
  *psVar3 = *psVar3 + (__return_storage_ptr__->testCases).failedButOk;
  pIVar5 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  uVar12 = (this->m_totals).assertions.failed;
  iVar7 = (*(((this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_NonCopyable)._vptr_NonCopyable[9])();
  TestCaseStats::TestCaseStats
            (&local_198,&testCase->super_TestCaseInfo,__return_storage_ptr__,&local_228,&local_248,
             (ulong)(long)iVar7 <= uVar12);
  (*pIVar5->_vptr_IStreamingReporter[0xc])(pIVar5,&local_198);
  TestCaseStats::~TestCaseStats(&local_198);
  this->m_activeTestCase = (TestCase *)0x0;
  this->m_testCaseTracker = (ITracker *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  clara::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&local_208.skippedTestReasons._M_t);
  return __return_storage_ptr__;
}

Assistant:

Totals RunContext::runTest(TestCase const& testCase) {
        Totals prevTotals = m_totals;

        std::string redirectedCout;
        std::string redirectedCerr;

        auto const& testInfo = testCase.getTestCaseInfo();

        onTestBegin();
        m_reporter->testCaseStarting(testInfo);

        m_activeTestCase = &testCase;

        ITracker& rootTracker = m_trackerContext.startRun();
        assert(rootTracker.isSectionTracker());
        static_cast<SectionTracker&>(rootTracker).addInitialFilters(m_config->getSectionsToRun());
        do {
            m_trackerContext.startCycle();
            m_testCaseTracker = &SectionTracker::acquire(m_trackerContext, TestCaseTracking::NameAndLocation(testInfo.name, testInfo.lineInfo));
            runCurrentTest(redirectedCout, redirectedCerr);
        } while (!m_testCaseTracker->isSuccessfullyCompleted() && !aborting());

        if (skippedTest()) {
            m_totals.skippedTests++;
            m_totals.skippedTestReasons[m_skippedTestReason]++;
        }
        Totals deltaTotals = m_totals.delta(prevTotals);
        if (testInfo.expectedToFail() && deltaTotals.testCases.passed > 0) {
            deltaTotals.assertions.failed++;
            deltaTotals.testCases.passed--;
            deltaTotals.testCases.failed++;
        }
        m_totals.testCases += deltaTotals.testCases;
        m_reporter->testCaseEnded(TestCaseStats(testInfo,
                                  deltaTotals,
                                  redirectedCout,
                                  redirectedCerr,
                                  aborting()));

        m_activeTestCase = nullptr;
        m_testCaseTracker = nullptr;

        return deltaTotals;
    }